

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O3

char * google::protobuf::internal::
       FieldParser<google::protobuf::internal::UnknownFieldLiteParserHelper>
                 (uint64_t tag,UnknownFieldLiteParserHelper *field_parser,char *ptr,
                 ParseContext *ctx)

{
  long lVar1;
  byte *pbVar2;
  uint32_t num;
  ulong uVar3;
  LogMessage LStack_18;
  
  num = (uint32_t)(tag >> 3);
  if (num == 0) goto switchD_0046986a_default;
  uVar3 = (ulong)((uint)tag & 7);
  switch(uVar3) {
  case 0:
    do {
      uVar3 = uVar3 + 1;
    } while (uVar3 != 10);
    uVar3 = (ulong)(byte)*ptr;
    if (*ptr < '\0') {
      ptr = ptr + 1;
      lVar1 = 7;
      pbVar2 = (byte *)0x0;
      do {
        uVar3 = ((ulong)(byte)*ptr - 1 << ((byte)lVar1 & 0x3f)) + uVar3;
        if (-1 < *ptr) goto LAB_0046987f;
        ptr = (char *)((byte *)ptr + 1);
        lVar1 = lVar1 + 7;
      } while (lVar1 != 0x46);
    }
    else {
LAB_0046987f:
      pbVar2 = (byte *)ptr + 1;
      UnknownFieldLiteParserHelper::AddVarint(field_parser,num,uVar3);
    }
    break;
  case 1:
    pbVar2 = (byte *)(ptr + 8);
    UnknownFieldLiteParserHelper::AddFixed64(field_parser,num,*(uint64_t *)ptr);
    break;
  case 2:
    pbVar2 = (byte *)UnknownFieldLiteParserHelper::ParseLengthDelimited(field_parser,num,ptr,ctx);
    goto LAB_004698b4;
  case 3:
    pbVar2 = (byte *)UnknownFieldLiteParserHelper::ParseGroup(field_parser,num,ptr,ctx);
LAB_004698b4:
    if (pbVar2 == (byte *)0x0) {
switchD_0046986a_default:
      pbVar2 = (byte *)0x0;
    }
    break;
  case 4:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
               ,0x55a);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&LStack_18,(char (*) [13])"Can\'t happen");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&LStack_18);
  case 5:
    pbVar2 = (byte *)(ptr + 4);
    UnknownFieldLiteParserHelper::AddFixed32(field_parser,num,*(uint32_t *)ptr);
    break;
  default:
    goto switchD_0046986a_default;
  }
  return (char *)pbVar2;
}

Assistant:

[[nodiscard]] const char* FieldParser(uint64_t tag, T& field_parser,
                                      const char* ptr, ParseContext* ctx) {
  uint32_t number = tag >> 3;
  GOOGLE_PROTOBUF_PARSER_ASSERT(number != 0);
  using WireType = internal::WireFormatLite::WireType;
  switch (tag & 7) {
    case WireType::WIRETYPE_VARINT: {
      uint64_t value;
      ptr = VarintParse(ptr, &value);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      field_parser.AddVarint(number, value);
      break;
    }
    case WireType::WIRETYPE_FIXED64: {
      uint64_t value = UnalignedLoad<uint64_t>(ptr);
      ptr += 8;
      field_parser.AddFixed64(number, value);
      break;
    }
    case WireType::WIRETYPE_LENGTH_DELIMITED: {
      ptr = field_parser.ParseLengthDelimited(number, ptr, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      break;
    }
    case WireType::WIRETYPE_START_GROUP: {
      ptr = field_parser.ParseGroup(number, ptr, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      break;
    }
    case WireType::WIRETYPE_END_GROUP: {
      ABSL_LOG(FATAL) << "Can't happen";
      break;
    }
    case WireType::WIRETYPE_FIXED32: {
      uint32_t value = UnalignedLoad<uint32_t>(ptr);
      ptr += 4;
      field_parser.AddFixed32(number, value);
      break;
    }
    default:
      return nullptr;
  }
  return ptr;
}